

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result wabt::ApplyNames(Module *module)

{
  Func *func;
  pointer pTVar1;
  pointer pTVar2;
  pointer ppGVar3;
  pointer ppEVar4;
  pointer pEVar5;
  pointer ppDVar6;
  DataSegment *pDVar7;
  pointer ppVVar8;
  Result RVar9;
  Index IVar10;
  pointer ppFVar11;
  pointer ppEVar12;
  pointer ppEVar13;
  Memory *pMVar14;
  Var *in_RCX;
  long lVar15;
  Var *var;
  Var *pVVar16;
  ElemSegment *pEVar17;
  Enum EVar18;
  ulong uVar19;
  ElemExpr *elem_expr;
  Var *pVVar20;
  pointer pEVar21;
  Var *pVVar22;
  bool bVar23;
  bool bVar24;
  string_view name;
  string_view name_00;
  NameApplier applier;
  NameApplier local_c8;
  
  local_c8.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameApplier_0019a730;
  local_c8.module_ = (Module *)0x0;
  local_c8.current_func_ = (Func *)0x0;
  ExprVisitor::ExprVisitor(&local_c8.visitor_,(Delegate *)&local_c8);
  local_c8.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar11 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_c8.module_ = module;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar11) {
    bVar23 = true;
    pVVar16 = (Var *)0x0;
    do {
      func = ppFVar11[(long)pVVar16];
      local_c8.current_func_ = func;
      if (((func->decl).has_func_type == true) &&
         (RVar9 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                            (&local_c8,&(func->decl).type_var), RVar9.enum_ == Error)) {
LAB_0014aad7:
        EVar18 = Error;
        if (bVar23) goto LAB_0014ae32;
        break;
      }
      pTVar1 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar2 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      IVar10 = LocalTypes::size(&func->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar1 - (long)pTVar2) >> 2) + IVar10),&func->bindings,
                 &local_c8.param_and_local_index_to_name_);
      RVar9 = ExprVisitor::VisitFunc(&local_c8.visitor_,func);
      if (RVar9.enum_ == Error) goto LAB_0014aad7;
      local_c8.current_func_ = (Func *)0x0;
      pVVar16 = (Var *)((long)&(pVVar16->loc).filename.data_ + 1);
      ppFVar11 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      in_RCX = (Var *)((long)(module->funcs).
                             super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3);
      bVar23 = pVVar16 < in_RCX;
    } while (bVar23);
  }
  ppGVar3 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar3) {
    RVar9 = ExprVisitor::VisitExprList(&local_c8.visitor_,&(*ppGVar3)->init_expr);
    EVar18 = Error;
    if (RVar9.enum_ == Error) goto LAB_0014ae32;
    in_RCX = (Var *)0x1;
    do {
      pVVar16 = in_RCX;
      ppGVar3 = (module->globals).
                super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar20 = (Var *)((long)(module->globals).
                              super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar3 >> 3);
      in_RCX = pVVar16;
      if (pVVar20 <= pVVar16) goto LAB_0014ab5b;
      RVar9 = ExprVisitor::VisitExprList(&local_c8.visitor_,&ppGVar3[(long)pVVar16]->init_expr);
      in_RCX = (Var *)((long)&(pVVar16->loc).filename.data_ + 1);
    } while (RVar9.enum_ != Error);
    if (pVVar16 < pVVar20) goto LAB_0014ae32;
  }
LAB_0014ab5b:
  ppEVar12 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  bVar23 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
           _M_impl.super__Vector_impl_data._M_finish != ppEVar12;
  if (bVar23) {
    pVVar16 = (Var *)0x0;
    do {
      if (((ppEVar12[(long)pVVar16]->decl).has_func_type == true) &&
         (RVar9 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                            (&local_c8,&(ppEVar12[(long)pVVar16]->decl).type_var),
         RVar9.enum_ == Error)) {
        EVar18 = Error;
        if (bVar23) goto LAB_0014ae32;
        break;
      }
      pVVar16 = (Var *)((long)&(pVVar16->loc).filename.data_ + 1);
      ppEVar12 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      in_RCX = (Var *)((long)(module->events).
                             super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar12 >> 3);
      bVar23 = pVVar16 < in_RCX;
    } while (bVar23);
  }
  ppEVar13 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar13) {
    pVVar16 = (Var *)0x0;
    do {
      if (ppEVar13[(long)pVVar16]->kind == First) {
        anon_unknown_11::NameApplier::UseNameForFuncVar(&local_c8,&ppEVar13[(long)pVVar16]->var);
      }
      pVVar16 = (Var *)((long)&(pVVar16->loc).filename.data_ + 1);
      ppEVar13 = (module->exports).
                 super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      in_RCX = (Var *)((long)(module->exports).
                             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar13 >> 3);
    } while (pVVar16 < in_RCX);
  }
  ppEVar4 = (module->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar4) {
    pEVar17 = *ppEVar4;
    RVar9 = anon_unknown_11::NameApplier::UseNameForTableVar(&local_c8,&pEVar17->table_var);
    EVar18 = Error;
    if ((RVar9.enum_ == Error) ||
       (RVar9 = ExprVisitor::VisitExprList(&local_c8.visitor_,&pEVar17->offset),
       RVar9.enum_ == Error)) goto LAB_0014ae32;
    bVar23 = true;
    uVar19 = 0;
    while( true ) {
      pEVar21 = (pEVar17->elem_exprs).
                super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar5 = (pEVar17->elem_exprs).
               super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while ((bVar24 = pEVar21 != pEVar5, bVar24 &&
             ((pEVar21->kind != RefFunc ||
              (RVar9 = anon_unknown_11::NameApplier::UseNameForFuncVar(&local_c8,&pEVar21->var),
              RVar9.enum_ != Error))))) {
        pEVar21 = pEVar21 + 1;
      }
      EVar18 = Error;
      if (bVar24) break;
      uVar19 = uVar19 + 1;
      ppEVar4 = (module->elem_segments).
                super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar15 = (long)(module->elem_segments).
                     super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4;
      bVar23 = uVar19 < (ulong)(lVar15 >> 3);
      in_RCX = (Var *)CONCAT71((int7)(lVar15 >> 0xb),bVar23);
      if (!bVar23) goto LAB_0014acf2;
      pEVar17 = ppEVar4[uVar19];
      RVar9 = anon_unknown_11::NameApplier::UseNameForTableVar(&local_c8,&pEVar17->table_var);
      if ((RVar9.enum_ == Error) ||
         (RVar9 = ExprVisitor::VisitExprList(&local_c8.visitor_,&pEVar17->offset),
         RVar9.enum_ == Error)) break;
    }
    if (bVar23) goto LAB_0014ae32;
  }
LAB_0014acf2:
  ppDVar6 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar6) {
    pDVar7 = *ppDVar6;
    pVVar16 = &pDVar7->memory_var;
    pMVar14 = Module::GetMemory(local_c8.module_,pVVar16);
    EVar18 = Error;
    if (pMVar14 == (Memory *)0x0) goto LAB_0014ae32;
    name.size_ = (size_type)pVVar16;
    name.data_ = (char *)(pMVar14->name)._M_string_length;
    anon_unknown_11::NameApplier::UseNameForVar
              ((NameApplier *)(pMVar14->name)._M_dataplus._M_p,name,in_RCX);
    RVar9 = ExprVisitor::VisitExprList(&local_c8.visitor_,&pDVar7->offset);
    if (RVar9.enum_ == Error) goto LAB_0014ae32;
    pVVar16 = (Var *)0x1;
    do {
      pVVar20 = pVVar16;
      ppDVar6 = (module->data_segments).
                super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar22 = (Var *)((long)(module->data_segments).
                              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar6 >> 3);
      if (pVVar22 <= pVVar20) goto LAB_0014adbd;
      pDVar7 = ppDVar6[(long)pVVar20];
      pVVar16 = &pDVar7->memory_var;
      var = pVVar20;
      pMVar14 = Module::GetMemory(local_c8.module_,pVVar16);
      if (pMVar14 == (Memory *)0x0) break;
      name_00.size_ = (size_type)pVVar16;
      name_00.data_ = (char *)(pMVar14->name)._M_string_length;
      anon_unknown_11::NameApplier::UseNameForVar
                ((NameApplier *)(pMVar14->name)._M_dataplus._M_p,name_00,var);
      RVar9 = ExprVisitor::VisitExprList(&local_c8.visitor_,&pDVar7->offset);
      pVVar16 = (Var *)((long)&(pVVar20->loc).filename.data_ + 1);
    } while (RVar9.enum_ != Error);
    if (pVVar20 < pVVar22) goto LAB_0014ae32;
  }
LAB_0014adbd:
  ppVVar8 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar23 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
           super__Vector_impl_data._M_finish != ppVVar8;
  if (bVar23) {
    RVar9 = anon_unknown_11::NameApplier::UseNameForFuncVar(&local_c8,*ppVVar8);
    if (RVar9.enum_ != Error) {
      uVar19 = 1;
      do {
        ppVVar8 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar23 = uVar19 < (ulong)((long)(module->starts).
                                        super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar8
                                 >> 3);
        if (!bVar23) goto LAB_0014ae27;
        RVar9 = anon_unknown_11::NameApplier::UseNameForFuncVar(&local_c8,ppVVar8[uVar19]);
        uVar19 = uVar19 + 1;
      } while (RVar9.enum_ != Error);
    }
    EVar18 = Error;
    if (bVar23) goto LAB_0014ae32;
  }
LAB_0014ae27:
  local_c8.module_ = (Module *)0x0;
  EVar18 = Ok;
LAB_0014ae32:
  local_c8.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameApplier_0019a730;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.labels_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.param_and_local_index_to_name_);
  if (local_c8.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar18;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}